

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

void __thiscall
Rml::DataViewCommon::DataViewCommon
          (DataViewCommon *this,Element *element,String *override_modifier,int sort_offset)

{
  DataView::DataView(&this->super_DataView,element,sort_offset);
  (this->super_DataView).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewCommon_003965f8;
  ::std::__cxx11::string::string((string *)&this->modifier,(string *)override_modifier);
  (this->expression)._M_t.
  super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>._M_t.
  super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>.
  super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl = (DataExpression *)0x0;
  return;
}

Assistant:

DataViewCommon::DataViewCommon(Element* element, String override_modifier, int sort_offset) :
	DataView(element, sort_offset), modifier(std::move(override_modifier))
{}